

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void pack_cell(int i,int j,int k,vector<int,_std::allocator<int>_> *particle_numbers,
              size_t *pn_index,vector<particle,_std::allocator<particle>_> *particles,
              size_t *p_index)

{
  int *piVar1;
  double *pdVar2;
  double *pdVar3;
  size_t sVar4;
  pointer ppVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  particle *ppVar19;
  particle *ppVar20;
  ulong uVar21;
  
  pdVar3 = *(double **)
            (*(long *)(*(long *)(*(long *)((long)psr._M_t.
                                                 super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                                                 .super__Head_base<0UL,_spatial_region_*,_false>.
                                                 _M_head_impl + 0x218) + (long)i * 8) + (long)j * 8)
            + (long)k * 0x10);
  (particle_numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_start[*pn_index] = 0;
  while (pdVar3 != (double *)0x0) {
    uVar21 = ((long)(particles->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(particles->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
    if (uVar21 < *p_index || uVar21 - *p_index == 0) {
      std::vector<particle,_std::allocator<particle>_>::resize(particles,uVar21 + 1 + (uVar21 >> 1))
      ;
    }
    sVar4 = *p_index;
    *p_index = sVar4 + 1;
    ppVar5 = (particles->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar6 = *pdVar3;
    dVar7 = pdVar3[1];
    dVar8 = pdVar3[2];
    dVar9 = pdVar3[3];
    dVar10 = pdVar3[4];
    dVar11 = pdVar3[5];
    dVar12 = pdVar3[6];
    dVar13 = pdVar3[7];
    dVar14 = pdVar3[6];
    dVar15 = pdVar3[7];
    dVar16 = pdVar3[8];
    dVar17 = pdVar3[9];
    dVar18 = pdVar3[10];
    ppVar19 = (particle *)pdVar3[0xb];
    ppVar20 = (particle *)pdVar3[0xc];
    pdVar2 = &ppVar5[sVar4].uz;
    *pdVar2 = pdVar3[5];
    pdVar2[1] = dVar14;
    pdVar2[2] = dVar15;
    pdVar2[3] = dVar16;
    pdVar2[4] = dVar17;
    pdVar2[5] = dVar18;
    pdVar2[6] = (double)ppVar19;
    pdVar2[7] = (double)ppVar20;
    ppVar5 = ppVar5 + sVar4;
    ppVar5->x = dVar6;
    ppVar5->y = dVar7;
    ppVar5->z = dVar8;
    ppVar5->ux = dVar9;
    ppVar5->uy = dVar10;
    ppVar5->uz = dVar11;
    ppVar5->g = dVar12;
    ppVar5->q = dVar13;
    pdVar3 = (double *)pdVar3[0xb];
    piVar1 = (particle_numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start + *pn_index;
    *piVar1 = *piVar1 + 1;
  }
  *pn_index = *pn_index + 1;
  return;
}

Assistant:

void pack_cell(int i, int j, int k, vector<int> & particle_numbers, size_t & pn_index, vector<particle> & particles, size_t & p_index) {
    particle* current = psr->cp[i][j][k].pl.head;
    particle_numbers[pn_index] = 0;
    while (current != 0) {
        if (particles.size() <= p_index) {
            particles.resize(3 * particles.size() / 2 + 1);
        }
        particles[p_index++] = *current;

        current = current->next;
        particle_numbers[pn_index]++;
    }
    pn_index++;
}